

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O1

void __thiscall
FIX::SessionID::SessionID
          (SessionID *this,string *beginString,string *senderCompID,string *targetCompID,
          string *sessionQualifier)

{
  pointer pcVar1;
  int iVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (this->m_beginString).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_003239f8;
  (this->m_beginString).super_StringField.super_FieldBase.m_tag = 8;
  (this->m_beginString).super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(this->m_beginString).super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (beginString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_beginString).super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + beginString->_M_string_length);
  (this->m_beginString).super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(this->m_beginString).super_StringField.super_FieldBase.m_data.field_2;
  (this->m_beginString).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  (this->m_beginString).super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (this->m_beginString).super_StringField.super_FieldBase.m_metrics.m_length = 0;
  (this->m_beginString).super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  (this->m_beginString).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00328470;
  (this->m_senderCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_003239f8;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_tag = 0x31;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(this->m_senderCompID).super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (senderCompID->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_senderCompID).super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + senderCompID->_M_string_length);
  (this->m_senderCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(this->m_senderCompID).super_StringField.super_FieldBase.m_data.field_2;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (this->m_senderCompID).super_StringField.super_FieldBase.m_metrics.m_length = 0;
  (this->m_senderCompID).super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  (this->m_senderCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00327af0;
  (this->m_targetCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_003239f8;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_tag = 0x38;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)&(this->m_targetCompID).super_StringField.super_FieldBase.m_string.field_2;
  pcVar1 = (targetCompID->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_targetCompID).super_StringField.super_FieldBase.m_string,pcVar1,
             pcVar1 + targetCompID->_M_string_length);
  (this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(this->m_targetCompID).super_StringField.super_FieldBase.m_data.field_2;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics.m_length = 0;
  (this->m_targetCompID).super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
  (this->m_targetCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00327ee0;
  (this->m_sessionQualifier)._M_dataplus._M_p = (pointer)&(this->m_sessionQualifier).field_2;
  pcVar1 = (sessionQualifier->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_sessionQualifier,pcVar1,pcVar1 + sessionQualifier->_M_string_length)
  ;
  this->m_isFIXT = false;
  (this->m_frozenString)._M_dataplus._M_p = (pointer)&(this->m_frozenString).field_2;
  (this->m_frozenString)._M_string_length = 0;
  (this->m_frozenString).field_2._M_local_buf[0] = '\0';
  toString(this,&this->m_frozenString);
  std::__cxx11::string::substr((ulong)local_50,(ulong)beginString);
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (iVar2 == 0) {
    this->m_isFIXT = true;
  }
  return;
}

Assistant:

SessionID(
      const std::string &beginString,
      const std::string &senderCompID,
      const std::string &targetCompID,
      const std::string &sessionQualifier = "")
      : m_beginString(BeginString(beginString)),
        m_senderCompID(SenderCompID(senderCompID)),
        m_targetCompID(TargetCompID(targetCompID)),
        m_sessionQualifier(sessionQualifier),
        m_isFIXT(false) {
    toString(m_frozenString);
    if (beginString.substr(0, 4) == "FIXT") {
      m_isFIXT = true;
    }
  }